

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

void __thiscall
trieste::PassDef::PassDef
          (PassDef *this,string *name,Wellformed *wf,flag direction,
          initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
          *r)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *__tmp;
  allocator_type local_41 [17];
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + name->_M_string_length);
  this->wf_ = wf;
  this->direction_ = direction;
  std::
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ::vector(&this->rules_,*r,local_41);
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rule_map).def.empty_ = true;
  lVar3 = 0x60;
  do {
    *(DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
      **)((long)(this->rule_map).def.map._M_elems + lVar3 + -0x60) = &this->rule_map;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x460);
  (this->rule_map).empty_ = true;
  lVar3 = 0x468;
  do {
    *(DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
      **)((long)(this->rule_map).def.map._M_elems + lVar3 + -0x60) = &this->rule_map;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x868);
  p_Var1 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->pre_once).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->pre_once).super__Function_base._M_functor + 8) = 0;
  (this->pre_once).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->pre_once)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->post_once).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->post_once).super__Function_base._M_functor + 8) = 0;
  (this->post_once).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->post_once)._M_invoker = (_Invoker_type)0x0;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->post_)._M_t._M_impl.super__Rb_tree_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compile_rules(this);
  return;
}

Assistant:

PassDef(
      const std::string& name,
      const wf::Wellformed& wf,
      dir::flag direction,
      const std::initializer_list<detail::PatternEffect<Node>>& r)
    : name_(name), wf_(wf), direction_(direction), rules_(r)
    {
      compile_rules();
    }